

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

BitpackingMode duckdb::BitpackingModeFromString(string *str)

{
  bool bVar1;
  BitpackingMode BVar2;
  string mode;
  string sStack_28;
  
  StringUtil::Lower(&sStack_28,str);
  bVar1 = ::std::operator==(&sStack_28,"auto");
  BVar2 = AUTO;
  if (!bVar1) {
    bVar1 = ::std::operator==(&sStack_28,"none");
    if (!bVar1) {
      bVar1 = ::std::operator==(&sStack_28,"constant");
      BVar2 = CONSTANT;
      if (!bVar1) {
        bVar1 = ::std::operator==(&sStack_28,"constant_delta");
        BVar2 = CONSTANT_DELTA;
        if (!bVar1) {
          bVar1 = ::std::operator==(&sStack_28,"delta_for");
          BVar2 = DELTA_FOR;
          if (!bVar1) {
            bVar1 = ::std::operator==(&sStack_28,"for");
            BVar2 = bVar1 * '\x05';
          }
        }
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&sStack_28);
  return BVar2;
}

Assistant:

BitpackingMode BitpackingModeFromString(const string &str) {
	auto mode = StringUtil::Lower(str);
	if (mode == "auto" || mode == "none") {
		return BitpackingMode::AUTO;
	} else if (mode == "constant") {
		return BitpackingMode::CONSTANT;
	} else if (mode == "constant_delta") {
		return BitpackingMode::CONSTANT_DELTA;
	} else if (mode == "delta_for") {
		return BitpackingMode::DELTA_FOR;
	} else if (mode == "for") {
		return BitpackingMode::FOR;
	} else {
		return BitpackingMode::INVALID;
	}
}